

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryProtocol.cpp
# Opt level: O0

Status __thiscall mognetwork::protocol::BinaryProtocol::onReadTrigger(BinaryProtocol *this)

{
  uint32_t uVar1;
  Status SVar2;
  char *data_00;
  size_type sVar3;
  unsigned_long *puVar4;
  reference pcVar5;
  TcpSocket *in_RDI;
  char *begin;
  Status status_1;
  size_t toGet;
  Status status;
  char *data;
  char buffer [1024];
  size_t readed;
  int in_stack_fffffffffffffb8c;
  size_t *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffbb0;
  value_type __x;
  undefined4 in_stack_fffffffffffffbb8;
  vector<char,_std::allocator<char>_> *this_00;
  unsigned_long local_438;
  unsigned_long local_430;
  Status local_424;
  long local_420;
  undefined1 local_418 [1024];
  size_t local_18;
  
  __x = (value_type)((ulong)in_stack_fffffffffffffbb0 >> 0x38);
  if ((in_RDI->m_pendingDatas).
      super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
      ._M_impl._M_node.super__List_node_base._M_next < (_List_node_base *)0x4) {
    local_420 = (long)&(in_RDI->m_pendingDatas).
                       super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                       ._M_impl._M_node.super__List_node_base._M_next +
                (long)&((in_RDI->m_pendingDatas).
                        super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                        ._M_impl._M_node.super__List_node_base._M_next)->_M_prev;
    local_424 = TcpSocket::receive(in_RDI,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                                   in_stack_fffffffffffffb90,in_stack_fffffffffffffb8c);
    (in_RDI->m_pendingDatas).
    super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         ((long)&((in_RDI->m_pendingDatas).
                  super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next + local_18);
    if (local_424 != Ok) {
      return local_424;
    }
    if ((_List_node_base *)0x3 <
        (in_RDI->m_pendingDatas).
        super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
        ._M_impl._M_node.super__List_node_base._M_next) {
      uVar1 = ntohl(*(uint32_t *)
                     &(in_RDI->m_pendingDatas).
                      super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                      ._M_impl._M_node.super__List_node_base._M_prev);
      *(uint32_t *)
       &(in_RDI->m_pendingDatas).
        super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
        ._M_impl._M_node.super__List_node_base._M_prev = uVar1;
    }
  }
  if ((_List_node_base *)0x3 <
      (in_RDI->m_pendingDatas).
      super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
      ._M_impl._M_node.super__List_node_base._M_next) {
    data_00 = (char *)(ulong)*(uint *)&(in_RDI->m_pendingDatas).
                                       super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                                       ._M_impl._M_node.super__List_node_base._M_prev;
    sVar3 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)
                       &(in_RDI->m_pendingDatas).
                        super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                        ._M_impl._M_node._M_size);
    local_438 = (long)data_00 - sVar3;
    this_00 = (vector<char,_std::allocator<char>_> *)0x400;
    puVar4 = std::min<unsigned_long>(&local_438,(unsigned_long *)&stack0xfffffffffffffbc0);
    local_430 = *puVar4;
    SVar2 = TcpSocket::receive(in_RDI,data_00,in_stack_fffffffffffffb98,in_stack_fffffffffffffb90,
                               in_stack_fffffffffffffb8c);
    if (SVar2 != Ok) {
      return SVar2;
    }
    (in_RDI->m_pendingDatas).
    super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
    ._M_impl._M_node.super__List_node_base._M_next =
         (_List_node_base *)
         ((long)&((in_RDI->m_pendingDatas).
                  super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next + local_18);
    if (local_18 != 0) {
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)
                 &(in_RDI->m_pendingDatas).
                  super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                  ._M_impl._M_node._M_size);
      std::vector<char,_std::allocator<char>_>::resize
                (this_00,CONCAT44(SVar2,in_stack_fffffffffffffbb8),__x);
      pcVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)
                          &(in_RDI->m_pendingDatas).
                           super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                           ._M_impl._M_node._M_size,0);
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)
                         &(in_RDI->m_pendingDatas).
                          super__List_base<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                          ._M_impl._M_node._M_size);
      memcpy(pcVar5 + (sVar3 - local_18),local_418,local_18);
    }
  }
  return Waiting;
}

Assistant:

Socket::Status BinaryProtocol::onReadTrigger()
    {
      std::size_t readed;
      char buffer[1024];

      // Get the size of the packet
      if (m_pendingDatas.readed < sizeof(uint32_t))
	{
	  char* data = reinterpret_cast<char*>(&m_pendingDatas.totalSize) + m_pendingDatas.readed;
	  Socket::Status status = m_socket->receive(data, sizeof(uint32_t) - m_pendingDatas.readed, readed, 0);
	  m_pendingDatas.readed += readed;
	  if (status != Socket::Ok)
	    return status;
	  if (m_pendingDatas.readed >= sizeof(uint32_t))
	    m_pendingDatas.totalSize = ntohl(m_pendingDatas.totalSize);
	}
      // Read the packet
      if (m_pendingDatas.readed >= sizeof(uint32_t))
	{
	  std::size_t toGet = std::min(static_cast<std::size_t>(m_pendingDatas.totalSize - m_pendingDatas.datas.size()), sizeof(buffer));
	  Socket::Status status = m_socket->receive(buffer, toGet, readed, 0);
	  if (status != Socket::Ok)
	    return status;
	  m_pendingDatas.readed += readed;
	  if (readed > 0)
	    {
	      m_pendingDatas.datas.resize(m_pendingDatas.datas.size() + readed);
	      char* begin = &m_pendingDatas.datas[0] + m_pendingDatas.datas.size() - readed;
	      std::memcpy(begin, buffer, readed);
	    }
	}
      return Socket::Waiting;
    }